

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_>
          *value)

{
  void *pvVar1;
  Nullable<const_char_*> pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  TestAllTypes **v1;
  void **ppvVar6;
  char *failure_msg;
  LogMessage *pLVar7;
  Arena *value_arena;
  Arena *my_arena;
  Rep *pRVar8;
  void **elems;
  Arena *arena;
  Arena *element_arena;
  Voidify local_29;
  void *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *value_local
  ;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)value;
  value_local = (Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_>
                 *)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestAllTypes*>
                 ((TestAllTypes **)&absl_log_internal_check_op_result);
  local_28 = (void *)0x0;
  ppvVar6 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_20 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestAllTypes*,decltype(nullptr)>
                       (v1,ppvVar6,"value != nullptr");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&element_arena,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x1ba,failure_msg);
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&element_arena);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar7);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&element_arena);
  }
  value_arena = GenericTypeHandler<proto2_unittest::TestAllTypes>::GetArena
                          ((Type *)absl_log_internal_check_op_result);
  my_arena = GetArena(this);
  if ((my_arena == value_arena) && (bVar3 = AllocatedSizeAtCapacity(this), !bVar3)) {
    ppvVar6 = elements(this);
    iVar5 = this->current_size_;
    iVar4 = allocated_size(this);
    if (iVar5 < iVar4) {
      pvVar1 = ppvVar6[this->current_size_];
      iVar5 = allocated_size(this);
      ppvVar6[iVar5] = pvVar1;
    }
    pcVar2 = absl_log_internal_check_op_result;
    iVar5 = ExchangeCurrentSize(this,this->current_size_ + 1);
    ppvVar6[iVar5] = pcVar2;
    bVar3 = using_sso(this);
    if (bVar3) {
      return;
    }
    pRVar8 = rep(this);
    pRVar8->allocated_size = pRVar8->allocated_size + 1;
    return;
  }
  AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
            (this,(Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_>
                   *)absl_log_internal_check_op_result,value_arena,my_arena);
  return;
}

Assistant:

void AddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    Arena* element_arena = TypeHandler::GetArena(value);
    Arena* arena = GetArena();
    if (arena != element_arena || AllocatedSizeAtCapacity()) {
      AddAllocatedSlowWithCopy<TypeHandler>(value, element_arena, arena);
      return;
    }
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at
    // least one slot that is not allocated).
    void** elems = elements();
    if (current_size_ < allocated_size()) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[allocated_size()] = elems[current_size_];
    }
    elems[ExchangeCurrentSize(current_size_ + 1)] = value;
    if (!using_sso()) ++rep()->allocated_size;
  }